

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

void print_node(FILE *fp,dtree_node_t *node,pset_t *pset)

{
  pset_t *pset_local;
  dtree_node_t *node_local;
  FILE *fp_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    fprintf((FILE *)fp,"-");
    fprintf((FILE *)fp," %.3e %u %u",node->wt_ent,(ulong)node->n_id,(ulong)node->clust);
    if (node->q != (void *)0x0) {
      fprintf((FILE *)fp," ");
      print_quest(fp,pset,(quest_t *)node->q);
      fprintf((FILE *)fp," %.3e",node->wt_ent_dec);
      fprintf((FILE *)fp," %.3e",(double)(float)node->occ);
    }
  }
  else {
    print_quest(fp,pset,(quest_t *)node->q);
    fprintf((FILE *)fp," %.3e %.3e %.3e",node->wt_ent,node->wt_ent_dec,(double)(float)node->occ);
  }
  return;
}

Assistant:

void
print_node(FILE *fp, dtree_node_t *node, pset_t *pset)
{
    if (!IS_LEAF(node)) {
	print_quest(fp, pset, (quest_t *)node->q);
	fprintf(fp, " %.3e %.3e %.3e",
/* DDDDBUG chk */
		node->wt_ent, node->wt_ent_dec,node->occ);
/**/
    }
    else {
	fprintf(fp, "-");
	fprintf(fp, " %.3e %u %u", node->wt_ent, node->n_id, node->clust);
	if (node->q) {
	    fprintf(fp, " ");
	    print_quest(fp, pset, (quest_t *)node->q);
	    fprintf(fp, " %.3e", node->wt_ent_dec);
/* DDDBUG for checks ..*/
	    fprintf(fp, " %.3e",node->occ);
/**/
	}
    }
}